

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool __thiscall QWidgetPrivate::setScreen(QWidgetPrivate *this,QScreen *screen)

{
  bool bVar1;
  QWidget *pQVar2;
  QWindow *pQVar3;
  QWidgetPrivate *in_RSI;
  QWidgetPrivate *in_RDI;
  QScreen *currentScreen;
  QWidget *q;
  QScreen *in_stack_ffffffffffffffb8;
  QWidget *in_stack_ffffffffffffffc0;
  QWidgetPrivate *local_38;
  WindowHandleMode mode;
  QWidgetPrivate *this_00;
  
  pQVar2 = q_func(in_RDI);
  mode = (WindowHandleMode)((ulong)pQVar2 >> 0x20);
  if ((in_RSI == (QWidgetPrivate *)0x0) ||
     (bVar1 = QWidget::isWindow(in_stack_ffffffffffffffc0), !bVar1)) {
    return false;
  }
  pQVar3 = windowHandle(in_RSI,mode);
  if (pQVar3 == (QWindow *)0x0) {
    local_38 = (QWidgetPrivate *)0x0;
  }
  else {
    windowHandle(in_RSI,mode);
    local_38 = (QWidgetPrivate *)QWindow::screen();
  }
  if (local_38 != in_RSI) {
    this_00 = in_RSI;
    topData(in_RSI);
    QPointer<QScreen>::operator=((QPointer<QScreen> *)in_RSI,in_stack_ffffffffffffffb8);
    pQVar3 = windowHandle(this_00,mode);
    if (pQVar3 != (QWindow *)0x0) {
      pQVar3 = windowHandle(this_00,mode);
      QWindow::setScreen((QScreen *)pQVar3);
    }
    return true;
  }
  return false;
}

Assistant:

bool QWidgetPrivate::setScreen(QScreen *screen)
{
    Q_Q(QWidget);
    if (!screen || !q->isWindow())
        return false;
    const QScreen *currentScreen = windowHandle() ? windowHandle()->screen() : nullptr;
    if (currentScreen != screen) {
        topData()->initialScreen = screen;
        if (windowHandle())
            windowHandle()->setScreen(screen);
        return true;
    }
    return false;
}